

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type output_variable_type,uint array_size)

{
  ostream *poVar1;
  _variable_type type;
  string output_variable_type_string;
  stringstream result_sstream;
  stringstream array_size_sstream;
  stringstream array_index_sstream;
  string local_528;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  stringstream local_4c8 [16];
  undefined1 local_4b8 [376];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_4c8);
  Utils::getVariableTypeString_abi_cxx11_(&local_528,(Utils *)(ulong)output_variable_type,type);
  if (1 < array_size) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[0]",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"#version 400\n\nout ",0x12);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_4b8,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," test_output",0xc);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_4e8,local_4e0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,";\n\nvoid main()\n{\n    test_output",0x20);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_508,local_500);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(2.0);\n}\n",9);
  if (local_508 != local_4f8) {
    operator_delete(local_508,local_4f8[0] + 1);
  }
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithDoublePrecisionOutput(
	Utils::_variable_type output_variable_type, unsigned int array_size)
{
	std::stringstream array_index_sstream;
	std::stringstream array_size_sstream;
	std::stringstream result_sstream;
	std::string		  output_variable_type_string = Utils::getVariableTypeString(output_variable_type);

	if (array_size > 1)
	{
		array_index_sstream << "[0]";
		array_size_sstream << "[" << array_size << "]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "out "
				   << output_variable_type_string << " test_output" << array_size_sstream.str() << ";\n"
																								   "\n"
																								   "void main()\n"
																								   "{\n"
																								   "    test_output"
				   << array_index_sstream.str() << " = " << output_variable_type_string << "(2.0);\n"
																						   "}\n";

	return result_sstream.str();
}